

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

char ** parse_string_list(char *str)

{
  char **ppcVar1;
  char *pcVar2;
  bool bVar3;
  char **result;
  char *p;
  int local_18;
  int j;
  int i;
  int count;
  char *str_local;
  
  j = 1;
  for (result = (char **)str; *(char *)result != '\0'; result = (char **)((long)result + 1)) {
    if (*(char *)result == ',') {
      j = j + 1;
    }
  }
  ppcVar1 = (char **)__ckd_calloc__((long)(j + 1),8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                    ,0x161);
  result = (char **)str;
  for (local_18 = 0; local_18 < j; local_18 = local_18 + 1) {
    p._4_4_ = 0;
    while( true ) {
      bVar3 = false;
      if (*(char *)((long)result + (long)p._4_4_) != ',') {
        bVar3 = *(char *)((long)result + (long)p._4_4_) != '\0';
      }
      if (!bVar3) break;
      p._4_4_ = p._4_4_ + 1;
    }
    pcVar2 = (char *)__ckd_calloc__((long)(p._4_4_ + 1),1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                    ,0x165);
    ppcVar1[local_18] = pcVar2;
    strncpy(ppcVar1[local_18],(char *)result,(long)p._4_4_);
    result = (char **)((long)result + (long)p._4_4_ + 1);
  }
  return ppcVar1;
}

Assistant:

static char **
parse_string_list(const char *str)
{
    int count, i, j;
    const char *p;
    char **result;

    p = str;
    count = 1;
    while (*p) {
	if (*p == ',')
    	    count++;
        p++;
    }
    /* Should end with NULL */
    result = (char **) ckd_calloc(count + 1, sizeof(char *));
    p = str;
    for (i = 0; i < count; i++) {
	for (j = 0; p[j] != ',' && p[j] != 0; j++);
	result[i] = (char *)ckd_calloc(j + 1, sizeof(char));
        strncpy( result[i], p, j);
        p = p + j + 1;
    }
    return result;
}